

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O3

void __thiscall
TPZDohrPrecond<float,_TPZDohrSubstruct<float>_>::CopyFrom
          (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *this,TPZMatrix<float> *mat)

{
  int64_t iVar1;
  TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *cp;
  
  if (mat != (TPZMatrix<float> *)0x0) {
    cp = (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)
         __dynamic_cast(mat,&TPZMatrix<float>::typeinfo,
                        &TPZDohrPrecond<float,TPZDohrSubstruct<float>>::typeinfo,0);
    if (cp != (TPZDohrPrecond<float,_TPZDohrSubstruct<float>_> *)0x0) {
      TPZMatrix<float>::operator=(&this->super_TPZMatrix<float>,(TPZMatrix<float> *)cp);
      if (cp != this) {
        std::__cxx11::
        list<TPZAutoPointer<TPZDohrSubstruct<float>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>>>>
        ::_M_assign_dispatch<std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<float>>>>
                  ((list<TPZAutoPointer<TPZDohrSubstruct<float>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>>>>
                    *)&this->fGlobal,
                   (cp->fGlobal).
                   super__List_base<TPZAutoPointer<TPZDohrSubstruct<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<float>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,&cp->fGlobal);
      }
      this->fNumThreads = cp->fNumThreads;
      iVar1 = cp->fNumCoarse;
      this->fCoarse = cp->fCoarse;
      this->fNumCoarse = iVar1;
      TPZAutoPointer<TPZDohrAssembly<float>_>::operator=(&this->fAssemble,&cp->fAssemble);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZDohrPrecond<float, TPZDohrSubstruct<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = float, TSubStruct = TPZDohrSubstruct<float>]"
             ,0x93);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }